

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O0

int __thiscall
QMessageDialogOptions::clone
          (QMessageDialogOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  long in_FS_OFFSET;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined> *other;
  QSharedPointer<QMessageDialogOptions> *this_00;
  totally_ordered_wrapper<QMessageDialogOptions_*> in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSharedPointer<QMessageDialogOptions> *)&stack0xffffffffffffffe8;
  other = (QSharedPointer<(anonymous_namespace)::MessageDialogCombined> *)this;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined>::
  create<(anonymous_namespace)::MessageDialogCombined_const&>
            ((MessageDialogCombined *)in_stack_ffffffffffffffe8.ptr);
  QSharedPointer<QMessageDialogOptions>::
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined,_true>(this_00,other);
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined>::~QSharedPointer
            ((QSharedPointer<(anonymous_namespace)::MessageDialogCombined> *)0x3b8501);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer<QMessageDialogOptions> QMessageDialogOptions::clone() const
{
    return QSharedPointer<MessageDialogCombined>::create(*static_cast<const MessageDialogCombined*>(this));
}